

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_45(QPDF *pdf,char *arg2)

{
  bool bVar1;
  vector<QPDFExc,_std::allocator<QPDFExc>_> local_50 [40];
  QPDFWriter local_28 [8];
  QPDFWriter w;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDFWriter::QPDFWriter(local_28,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(local_28,0));
  QPDFWriter::write();
  QPDF::getWarnings();
  bVar1 = std::vector<QPDFExc,_std::allocator<QPDFExc>_>::empty(local_50);
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector(local_50);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    QPDFWriter::~QPDFWriter(local_28);
    return;
  }
  exit(3);
}

Assistant:

static void
test_45(QPDF& pdf, char const* arg2)
{
    // Decode obfuscated files. This is here to help test with
    // files that trigger anti-virus warnings. See comments in
    // specific-bugs.test for details.
    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.write();
    if (!pdf.getWarnings().empty()) {
        exit(3);
    }
}